

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O1

void RescalerImportRowExpand_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  byte *pbVar1;
  undefined1 (*pauVar2) [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  rescaler_t *prVar6;
  short sVar7;
  short sVar8;
  ushort uVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [13];
  undefined1 auVar35 [13];
  undefined1 auVar36 [13];
  undefined1 auVar37 [13];
  undefined1 auVar38 [13];
  undefined1 auVar39 [13];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [13];
  undefined1 auVar51 [13];
  undefined1 auVar52 [13];
  unkuint9 Var53;
  undefined1 auVar54 [13];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [13];
  undefined1 auVar62 [13];
  undefined1 auVar63 [13];
  undefined1 auVar64 [13];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [13];
  undefined1 auVar68 [13];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  uint5 uVar73;
  uint uVar74;
  long lVar75;
  int iVar76;
  undefined1 (*pauVar77) [16];
  int iVar78;
  long lVar79;
  uint uVar80;
  ulong *puVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  int iVar85;
  int iVar86;
  rescaler_t *prVar87;
  ulong uVar88;
  undefined1 auVar89 [16];
  undefined1 uVar91;
  byte bVar92;
  undefined1 uVar93;
  undefined1 uVar94;
  undefined1 auVar90 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  
  auVar90 = _DAT_001b8240;
  auVar89 = _DAT_001b8230;
  uVar4 = wrk->x_add;
  iVar5 = wrk->src_width;
  if (0x7fff < (int)uVar4 || (long)iVar5 < 8) {
    uVar4 = wrk->num_channels;
    lVar75 = (long)(int)uVar4;
    if (0 < lVar75) {
      iVar76 = wrk->dst_width * uVar4;
      iVar5 = wrk->x_add;
      iVar86 = wrk->src_width;
      prVar6 = wrk->frow;
      lVar79 = 0;
      uVar83 = uVar4;
      do {
        bVar92 = src[lVar79];
        uVar82 = (uint)bVar92;
        uVar84 = (uint)bVar92;
        if (1 < iVar86) {
          uVar84 = (uint)src[lVar79 + lVar75];
        }
        prVar6[lVar79] = iVar5 * (uint)bVar92;
        if ((int)(uVar4 + (int)lVar79) < iVar76) {
          prVar87 = prVar6 + uVar83;
          iVar3 = wrk->x_sub;
          iVar85 = uVar4 + (int)lVar79;
          iVar78 = iVar5;
          uVar80 = uVar83;
          do {
            iVar78 = iVar78 - iVar3;
            uVar74 = uVar84;
            if (iVar78 < 0) {
              iVar85 = iVar85 + uVar4;
              iVar78 = iVar78 + iVar5;
              uVar74 = (uint)src[iVar85];
              uVar82 = uVar84;
            }
            uVar84 = uVar74;
            *prVar87 = (uVar82 - uVar84) * iVar78 + uVar84 * iVar5;
            prVar87 = prVar87 + lVar75;
            uVar80 = uVar80 + uVar4;
          } while ((int)uVar80 < iVar76);
        }
        lVar79 = lVar79 + 1;
        uVar83 = uVar83 + 1;
      } while (lVar79 != lVar75);
    }
    return;
  }
  pauVar77 = (undefined1 (*) [16])wrk->frow;
  pauVar2 = (undefined1 (*) [16])
            ((long)*pauVar77 + (long)wrk->dst_width * (long)wrk->num_channels * 4);
  if (wrk->num_channels == 4) {
    uVar88 = *(ulong *)src;
    uVar94 = (undefined1)(uVar88 >> 0x38);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar88;
    auVar10[0xe] = uVar94;
    uVar93 = (undefined1)(uVar88 >> 0x30);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar88;
    auVar14[0xc] = uVar93;
    auVar14._13_2_ = auVar10._13_2_;
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar88;
    auVar18._12_3_ = auVar14._12_3_;
    bVar92 = (byte)(uVar88 >> 0x28);
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar88;
    auVar22[10] = bVar92;
    auVar22._11_4_ = auVar18._11_4_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar88;
    auVar26._10_5_ = auVar22._10_5_;
    auVar95[4] = (byte)(uVar88 >> 0x20);
    auVar30[8] = auVar95[4];
    auVar30._0_8_ = uVar88;
    auVar30._9_6_ = auVar26._9_6_;
    auVar44._7_8_ = 0;
    auVar44._0_7_ = auVar30._8_7_;
    uVar91 = (undefined1)(uVar88 >> 0x18);
    auVar45._8_7_ = 0;
    auVar45._0_8_ = SUB158(auVar44 << 0x40,7);
    auVar46._9_6_ = 0;
    auVar46._0_9_ = SUB159(auVar45 << 0x38,6);
    auVar47._10_5_ = 0;
    auVar47._0_10_ = SUB1510(auVar46 << 0x30,5);
    auVar48._11_4_ = 0;
    auVar48._0_11_ = SUB1511(auVar47 << 0x28,4);
    auVar49._12_3_ = 0;
    auVar49._0_12_ = SUB1512(auVar48 << 0x20,3);
    auVar42._13_2_ = 0;
    auVar42._0_13_ = SUB1513(auVar49 << 0x18,2);
    auVar42 = auVar42 << 0x10;
    auVar34[0xb] = 0;
    auVar34._0_11_ = auVar42._0_11_;
    auVar34[0xc] = uVar91;
    auVar35[10] = 0;
    auVar35._0_10_ = auVar42._0_10_;
    auVar35._11_2_ = auVar34._11_2_;
    auVar36[9] = 0;
    auVar36._0_9_ = auVar42._0_9_;
    auVar36._10_3_ = auVar35._10_3_;
    uVar73 = CONCAT41(auVar36._9_4_,(char)(uVar88 >> 0x10));
    auVar50._5_8_ = 0;
    auVar50._0_5_ = uVar73;
    auVar51._6_7_ = 0;
    auVar51._0_6_ = SUB136(auVar50 << 0x40,7);
    auVar52._7_6_ = 0;
    auVar52._0_7_ = SUB137(auVar51 << 0x38,6);
    Var53 = CONCAT81(SUB138(auVar52 << 0x30,5),(char)(uVar88 >> 8));
    auVar67._9_4_ = 0;
    auVar67._0_9_ = Var53;
    auVar54._10_3_ = 0;
    auVar54._0_10_ = SUB1310(auVar67 << 0x20,3);
    auVar97._0_2_ = (ushort)uVar88 & 0xff;
    auVar97._2_11_ = SUB1311(auVar54 << 0x18,2);
    auVar97._13_3_ = 0;
    auVar99._4_4_ = (int)Var53;
    auVar99._0_4_ = (int)uVar73;
    auVar99[8] = uVar91;
    auVar99._9_3_ = 0;
    auVar99[0xc] = uVar91;
    auVar99._13_3_ = 0;
    auVar95._1_3_ = 0;
    auVar95[0] = auVar95[4];
    auVar100._1_3_ = 0;
    auVar100[0] = bVar92;
    auVar100[4] = uVar93;
    auVar100._5_3_ = 0;
    auVar100[8] = uVar94;
    auVar100._9_3_ = 0;
    auVar100[0xc] = uVar94;
    auVar100._13_3_ = 0;
    auVar100 = auVar100 & _DAT_001b8230 | ~_DAT_001b8230 & auVar99;
    auVar95._5_3_ = 0;
    auVar95[8] = bVar92;
    auVar95._9_3_ = 0;
    auVar95[0xc] = uVar94;
    auVar95._13_3_ = 0;
    auVar103 = pshufhw(~_DAT_001b8230 & auVar99,auVar95,0xc4);
    auVar95 = pshuflw(auVar97,auVar97,0xec);
    auVar106._0_4_ = auVar95._0_4_;
    auVar106._12_4_ = auVar95._12_4_;
    auVar106._4_4_ = auVar106._12_4_;
    auVar106._8_4_ = auVar95._4_4_;
    auVar95 = auVar106 & _DAT_001b8240 | ~_DAT_001b8240 & auVar103;
    sVar7 = auVar95._0_2_;
    sVar8 = auVar95._2_2_;
    auVar103[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar95[2] - (0xff < sVar8);
    auVar103[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0] - (0xff < sVar7);
    sVar7 = auVar95._4_2_;
    auVar103[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[4] - (0xff < sVar7);
    sVar7 = auVar95._6_2_;
    auVar103[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[6] - (0xff < sVar7);
    sVar7 = auVar95._8_2_;
    auVar103[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[8] - (0xff < sVar7);
    sVar7 = auVar95._10_2_;
    auVar103[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[10] - (0xff < sVar7);
    sVar7 = auVar95._12_2_;
    auVar103[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xc] - (0xff < sVar7);
    sVar7 = auVar95._14_2_;
    auVar103[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xe] - (0xff < sVar7);
    sVar7 = auVar100._0_2_;
    auVar103[8] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[0] - (0xff < sVar7);
    sVar7 = auVar100._2_2_;
    auVar103[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[2] - (0xff < sVar7);
    uVar9 = auVar100._4_2_;
    auVar103[10] = (uVar9 != 0) * (uVar9 < 0x100) * auVar100[4] - (0xff < uVar9);
    auVar103[0xb] = 0;
    sVar7 = auVar100._8_2_;
    auVar103[0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[8] - (0xff < sVar7);
    sVar7 = auVar100._10_2_;
    auVar103[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[10] - (0xff < sVar7);
    sVar7 = auVar100._12_2_;
    auVar103[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[0xc] - (0xff < sVar7);
    sVar7 = auVar100._14_2_;
    auVar103[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar100[0xe] - (0xff < sVar7);
    puVar81 = (ulong *)(src + 4);
    uVar83 = uVar4;
    do {
      uVar84 = (uVar4 - uVar83) * 0x10000 | uVar83;
      auVar101._4_4_ = uVar84;
      auVar101._0_4_ = uVar84;
      auVar101._8_4_ = uVar84;
      auVar101._12_4_ = uVar84;
      auVar95 = pmaddwd(auVar101,auVar103);
      *pauVar77 = auVar95;
      pauVar77 = pauVar77 + 1;
      if ((pauVar77 < pauVar2) && (uVar83 = uVar83 - wrk->x_sub, (int)uVar83 < 0)) {
        uVar88 = *puVar81;
        uVar94 = (undefined1)(uVar88 >> 0x38);
        auVar11._8_6_ = 0;
        auVar11._0_8_ = uVar88;
        auVar11[0xe] = uVar94;
        uVar93 = (undefined1)(uVar88 >> 0x30);
        auVar15._8_4_ = 0;
        auVar15._0_8_ = uVar88;
        auVar15[0xc] = uVar93;
        auVar15._13_2_ = auVar11._13_2_;
        auVar19._8_4_ = 0;
        auVar19._0_8_ = uVar88;
        auVar19._12_3_ = auVar15._12_3_;
        bVar92 = (byte)(uVar88 >> 0x28);
        auVar23._8_2_ = 0;
        auVar23._0_8_ = uVar88;
        auVar23[10] = bVar92;
        auVar23._11_4_ = auVar19._11_4_;
        auVar27._8_2_ = 0;
        auVar27._0_8_ = uVar88;
        auVar27._10_5_ = auVar23._10_5_;
        auVar96[4] = (byte)(uVar88 >> 0x20);
        auVar31[8] = auVar96[4];
        auVar31._0_8_ = uVar88;
        auVar31._9_6_ = auVar27._9_6_;
        auVar55._7_8_ = 0;
        auVar55._0_7_ = auVar31._8_7_;
        uVar91 = (undefined1)(uVar88 >> 0x18);
        auVar56._8_7_ = 0;
        auVar56._0_8_ = SUB158(auVar55 << 0x40,7);
        auVar57._9_6_ = 0;
        auVar57._0_9_ = SUB159(auVar56 << 0x38,6);
        auVar58._10_5_ = 0;
        auVar58._0_10_ = SUB1510(auVar57 << 0x30,5);
        auVar59._11_4_ = 0;
        auVar59._0_11_ = SUB1511(auVar58 << 0x28,4);
        auVar60._12_3_ = 0;
        auVar60._0_12_ = SUB1512(auVar59 << 0x20,3);
        auVar43._13_2_ = 0;
        auVar43._0_13_ = SUB1513(auVar60 << 0x18,2);
        auVar43 = auVar43 << 0x10;
        auVar37[0xb] = 0;
        auVar37._0_11_ = auVar43._0_11_;
        auVar37[0xc] = uVar91;
        auVar38[10] = 0;
        auVar38._0_10_ = auVar43._0_10_;
        auVar38._11_2_ = auVar37._11_2_;
        auVar39[9] = 0;
        auVar39._0_9_ = auVar43._0_9_;
        auVar39._10_3_ = auVar38._10_3_;
        uVar73 = CONCAT41(auVar39._9_4_,(char)(uVar88 >> 0x10));
        auVar61._5_8_ = 0;
        auVar61._0_5_ = uVar73;
        auVar62._6_7_ = 0;
        auVar62._0_6_ = SUB136(auVar61 << 0x40,7);
        auVar63._7_6_ = 0;
        auVar63._0_7_ = SUB137(auVar62 << 0x38,6);
        Var53 = CONCAT81(SUB138(auVar63 << 0x30,5),(char)(uVar88 >> 8));
        auVar68._9_4_ = 0;
        auVar68._0_9_ = Var53;
        auVar64._10_3_ = 0;
        auVar64._0_10_ = SUB1310(auVar68 << 0x20,3);
        auVar102._0_2_ = (ushort)uVar88 & 0xff;
        auVar102._2_11_ = SUB1311(auVar64 << 0x18,2);
        auVar102._13_3_ = 0;
        auVar104._4_4_ = (int)Var53;
        auVar104._0_4_ = (int)uVar73;
        auVar104[8] = uVar91;
        auVar104._9_3_ = 0;
        auVar104[0xc] = uVar91;
        auVar104._13_3_ = 0;
        auVar96._1_3_ = 0;
        auVar96[0] = auVar96[4];
        auVar105._1_3_ = 0;
        auVar105[0] = bVar92;
        auVar105[4] = uVar93;
        auVar105._5_3_ = 0;
        auVar105[8] = uVar94;
        auVar105._9_3_ = 0;
        auVar105[0xc] = uVar94;
        auVar105._13_3_ = 0;
        auVar106 = auVar105 & auVar89 | ~auVar89 & auVar104;
        auVar96._5_3_ = 0;
        auVar96[8] = bVar92;
        auVar96._9_3_ = 0;
        auVar96[0xc] = uVar94;
        auVar96._13_3_ = 0;
        auVar95 = pshufhw(auVar96,auVar96,0xc4);
        auVar97 = pshuflw(auVar95,auVar102,0xec);
        auVar98._0_4_ = auVar97._0_4_;
        auVar98._12_4_ = auVar97._12_4_;
        auVar98._4_4_ = auVar98._12_4_;
        auVar98._8_4_ = auVar97._4_4_;
        auVar95 = auVar98 & auVar90 | ~auVar90 & auVar95;
        sVar7 = auVar95._0_2_;
        sVar8 = auVar95._2_2_;
        auVar103[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar95[2] - (0xff < sVar8);
        auVar103[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0] - (0xff < sVar7);
        sVar7 = auVar95._4_2_;
        auVar103[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[4] - (0xff < sVar7);
        sVar7 = auVar95._6_2_;
        auVar103[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[6] - (0xff < sVar7);
        sVar7 = auVar95._8_2_;
        auVar103[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[8] - (0xff < sVar7);
        sVar7 = auVar95._10_2_;
        auVar103[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[10] - (0xff < sVar7);
        sVar7 = auVar95._12_2_;
        auVar103[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xc] - (0xff < sVar7);
        sVar7 = auVar95._14_2_;
        auVar103[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar95[0xe] - (0xff < sVar7);
        sVar7 = auVar106._0_2_;
        auVar103[8] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[0] - (0xff < sVar7);
        sVar7 = auVar106._2_2_;
        auVar103[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[2] - (0xff < sVar7);
        uVar9 = auVar106._4_2_;
        auVar103[10] = (uVar9 != 0) * (uVar9 < 0x100) * auVar106[4] - (0xff < uVar9);
        auVar103[0xb] = 0;
        sVar7 = auVar106._8_2_;
        auVar103[0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[8] - (0xff < sVar7);
        sVar7 = auVar106._10_2_;
        auVar103[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[10] - (0xff < sVar7);
        sVar7 = auVar106._12_2_;
        auVar103[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[0xc] - (0xff < sVar7);
        sVar7 = auVar106._14_2_;
        auVar103[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar106[0xe] - (0xff < sVar7);
        puVar81 = (ulong *)((long)puVar81 + 4);
        uVar83 = uVar83 + uVar4;
      }
    } while (pauVar77 < pauVar2);
  }
  else {
    uVar88 = *(ulong *)src;
    auVar12._8_6_ = 0;
    auVar12._0_8_ = uVar88;
    auVar12[0xe] = (char)(uVar88 >> 0x38);
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar88;
    auVar16[0xc] = (char)(uVar88 >> 0x30);
    auVar16._13_2_ = auVar12._13_2_;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = uVar88;
    auVar20._12_3_ = auVar16._12_3_;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar88;
    auVar24[10] = (char)(uVar88 >> 0x28);
    auVar24._11_4_ = auVar20._11_4_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = uVar88;
    auVar28._10_5_ = auVar24._10_5_;
    auVar32[8] = (char)(uVar88 >> 0x20);
    auVar32._0_8_ = uVar88;
    auVar32._9_6_ = auVar28._9_6_;
    auVar65._7_8_ = 0;
    auVar65._0_7_ = auVar32._8_7_;
    auVar69._1_8_ = SUB158(auVar65 << 0x40,7);
    auVar69[0] = (char)(uVar88 >> 0x18);
    auVar69._9_6_ = 0;
    auVar70._1_10_ = SUB1510(auVar69 << 0x30,5);
    auVar70[0] = (char)(uVar88 >> 0x10);
    auVar70._11_4_ = 0;
    auVar40[2] = (char)(uVar88 >> 8);
    auVar40._0_2_ = (ushort)uVar88;
    auVar40._3_12_ = SUB1512(auVar70 << 0x20,3);
    auVar89._0_2_ = (ushort)uVar88 & 0xff;
    auVar89._2_13_ = auVar40._2_13_;
    auVar89[0xf] = 0;
    puVar81 = (ulong *)(src + 7);
    iVar86 = 7;
    uVar83 = uVar4;
    do {
      auVar90 = pmaddwd(ZEXT416((uVar4 - uVar83) * 0x10000 | uVar83),auVar89);
      *(rescaler_t *)*pauVar77 = auVar90._0_4_;
      pauVar77 = (undefined1 (*) [16])((long)*pauVar77 + 4);
      if ((pauVar77 < pauVar2) && (uVar83 = uVar83 - wrk->x_sub, (int)uVar83 < 0)) {
        iVar86 = iVar86 + -1;
        if (iVar86 == 0) {
          if (src + (long)iVar5 + -8 < puVar81) {
            pbVar1 = (byte *)((long)puVar81 + 1);
            puVar81 = (ulong *)((long)puVar81 + 1);
            uVar88 = auVar89._2_8_;
            auVar89._8_8_ = auVar89._8_8_ >> 0x10;
            auVar89._0_8_ = uVar88 & 0xffffffff0000ffff | (ulong)*pbVar1 << 0x10;
            iVar86 = 1;
          }
          else {
            uVar88 = *puVar81;
            auVar13._8_6_ = 0;
            auVar13._0_8_ = uVar88;
            auVar13[0xe] = (char)(uVar88 >> 0x38);
            auVar17._8_4_ = 0;
            auVar17._0_8_ = uVar88;
            auVar17[0xc] = (char)(uVar88 >> 0x30);
            auVar17._13_2_ = auVar13._13_2_;
            auVar21._8_4_ = 0;
            auVar21._0_8_ = uVar88;
            auVar21._12_3_ = auVar17._12_3_;
            auVar25._8_2_ = 0;
            auVar25._0_8_ = uVar88;
            auVar25[10] = (char)(uVar88 >> 0x28);
            auVar25._11_4_ = auVar21._11_4_;
            auVar29._8_2_ = 0;
            auVar29._0_8_ = uVar88;
            auVar29._10_5_ = auVar25._10_5_;
            auVar33[8] = (char)(uVar88 >> 0x20);
            auVar33._0_8_ = uVar88;
            auVar33._9_6_ = auVar29._9_6_;
            auVar66._7_8_ = 0;
            auVar66._0_7_ = auVar33._8_7_;
            auVar71._1_8_ = SUB158(auVar66 << 0x40,7);
            auVar71[0] = (char)(uVar88 >> 0x18);
            auVar71._9_6_ = 0;
            auVar72._1_10_ = SUB1510(auVar71 << 0x30,5);
            auVar72[0] = (char)(uVar88 >> 0x10);
            auVar72._11_4_ = 0;
            auVar41[2] = (char)(uVar88 >> 8);
            auVar41._0_2_ = (ushort)uVar88;
            auVar41._3_12_ = SUB1512(auVar72 << 0x20,3);
            auVar89._0_2_ = (ushort)uVar88 & 0xff;
            auVar89._2_13_ = auVar41._2_13_;
            auVar89[0xf] = 0;
            puVar81 = (ulong *)((long)puVar81 + 7);
            iVar86 = 7;
          }
        }
        else {
          auVar89 = auVar89 >> 0x10;
        }
        uVar83 = uVar83 + uVar4;
      }
    } while (pauVar77 < pauVar2);
  }
  return;
}

Assistant:

static void RescalerImportRowExpand_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = frow + wrk->dst_width * wrk->num_channels;
  const int x_add = wrk->x_add;
  int accum = x_add;
  __m128i cur_pixels;

  // SSE2 implementation only works with 16b signed arithmetic at max.
  if (wrk->src_width < 8 || accum >= (1 << 15)) {
    WebPRescalerImportRowExpand_C(wrk, src);
    return;
  }

  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  if (wrk->num_channels == 4) {
    LoadTwoPixels_SSE2(src, &cur_pixels);
    src += 4;
    while (1) {
      const __m128i mult = _mm_set1_epi32(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      _mm_storeu_si128((__m128i*)frow, out);
      frow += 4;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        LoadTwoPixels_SSE2(src, &cur_pixels);
        src += 4;
        accum += x_add;
      }
    }
  } else {
    int left;
    const uint8_t* const src_limit = src + wrk->src_width - 8;
    LoadEightPixels_SSE2(src, &cur_pixels);
    src += 7;
    left = 7;
    while (1) {
      const __m128i mult = _mm_cvtsi32_si128(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      assert(sizeof(*frow) == sizeof(uint32_t));
      WebPInt32ToMem((uint8_t*)frow, _mm_cvtsi128_si32(out));
      frow += 1;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        if (--left) {
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
        } else if (src <= src_limit) {
          LoadEightPixels_SSE2(src, &cur_pixels);
          src += 7;
          left = 7;
        } else {   // tail
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
          cur_pixels = _mm_insert_epi16(cur_pixels, src[1], 1);
          src += 1;
          left = 1;
        }
        accum += x_add;
      }
    }
  }
  assert(accum == 0);
}